

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O3

VersionBitsTester * __thiscall
VersionBitsTester::TestStateSinceHeight(VersionBitsTester *this,int height,int height_delayed)

{
  int *args;
  pointer ppCVar1;
  int iVar2;
  uint64_t uVar3;
  int bits;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long lVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar7;
  CBlockIndex *local_168;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  lazy_ostream local_b0;
  undefined1 *local_a0;
  string *local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar1 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppCVar1) {
    local_168 = (CBlockIndex *)0x0;
  }
  else {
    local_168 = ppCVar1[-1];
  }
  args = &this->num;
  lVar6 = 0;
  bits = 0;
  do {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&this->m_rng->super_RandomMixin<FastRandomContext>,bits);
    if (uVar3 == 0) {
      local_68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_60 = "";
      local_78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x87;
      file.m_begin = (iterator)&local_68;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
      iVar2 = AbstractThresholdConditionChecker::GetStateSinceHeightFor
                        ((AbstractThresholdConditionChecker *)
                         ((long)&this->checker[0].super_AbstractThresholdConditionChecker.
                                 _vptr_AbstractThresholdConditionChecker + lVar6),local_168,
                         &paramsDummy,
                         (ThresholdConditionCache *)
                         (&this->checker[0].cache._M_t._M_impl.field_0x0 + lVar6));
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == height);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      tinyformat::format<int>(&local_58,"Test %i for StateSinceHeight",args);
      local_b0.m_empty = false;
      local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_b8 = "";
      pvVar4 = (iterator)0x1;
      pvVar5 = (iterator)0x1;
      local_98 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b0,1,1,WARN,_cVar7,(size_t)&local_c0,0x87);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
      local_d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_c8 = "";
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x88;
      file_00.m_begin = (iterator)&local_d0;
      msg_00.m_end = pvVar5;
      msg_00.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e0,
                 msg_00);
      iVar2 = AbstractThresholdConditionChecker::GetStateSinceHeightFor
                        ((AbstractThresholdConditionChecker *)
                         ((long)&this->checker_delayed[0].super_TestConditionChecker.
                                 super_AbstractThresholdConditionChecker.
                                 _vptr_AbstractThresholdConditionChecker + lVar6),local_168,
                         &paramsDummy,
                         (ThresholdConditionCache *)
                         (&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
                           field_0x0 + lVar6));
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == height_delayed);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      tinyformat::format<int>(&local_58,"Test %i for StateSinceHeight (delayed)",args);
      local_b0.m_empty = false;
      local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_e8 = "";
      pvVar4 = (iterator)0x1;
      pvVar5 = (iterator)0x1;
      local_98 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b0,1,1,WARN,_cVar7,(size_t)&local_f0,0x88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_f8 = "";
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      local_108 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x89;
      file_01.m_begin = (iterator)&local_100;
      msg_01.m_end = pvVar5;
      msg_01.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_110,
                 msg_01);
      iVar2 = AbstractThresholdConditionChecker::GetStateSinceHeightFor
                        ((AbstractThresholdConditionChecker *)
                         ((long)&this->checker_always[0].super_TestConditionChecker.
                                 super_AbstractThresholdConditionChecker.
                                 _vptr_AbstractThresholdConditionChecker + lVar6),local_168,
                         &paramsDummy,
                         (ThresholdConditionCache *)
                         (&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                           field_0x0 + lVar6));
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      tinyformat::format<int>(&local_58,"Test %i for StateSinceHeight (always active)",args);
      local_b0.m_empty = false;
      local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_120 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_118 = "";
      pvVar4 = (iterator)0x1;
      pvVar5 = (iterator)0x1;
      local_98 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b0,1,1,WARN,_cVar7,(size_t)&local_120,0x89);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
      local_130 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_128 = "";
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x8a;
      file_02.m_begin = (iterator)&local_130;
      msg_02.m_end = pvVar5;
      msg_02.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_140,
                 msg_02);
      iVar2 = AbstractThresholdConditionChecker::GetStateSinceHeightFor
                        ((AbstractThresholdConditionChecker *)
                         ((long)&this->checker_never[0].super_TestConditionChecker.
                                 super_AbstractThresholdConditionChecker.
                                 _vptr_AbstractThresholdConditionChecker + lVar6),local_168,
                         &paramsDummy,
                         (ThresholdConditionCache *)
                         (&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                           field_0x0 + lVar6));
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      tinyformat::format<int>(&local_58,"Test %i for StateSinceHeight (never active)",args);
      local_b0.m_empty = false;
      local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_150 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_148 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x1;
      local_98 = &local_58;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b0,1,1,WARN,_cVar7,(size_t)&local_150,0x8a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
    }
    bits = bits + 1;
    lVar6 = lVar6 + 0x38;
  } while (lVar6 != 0x150);
  this->num = this->num + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& TestStateSinceHeight(int height, int height_delayed)
    {
        const CBlockIndex* tip = Tip();
        for (int i = 0; i < CHECKERS; i++) {
            if (m_rng.randbits(i) == 0) {
                BOOST_CHECK_MESSAGE(checker[i].GetStateSinceHeightFor(tip) == height, strprintf("Test %i for StateSinceHeight", num));
                BOOST_CHECK_MESSAGE(checker_delayed[i].GetStateSinceHeightFor(tip) == height_delayed, strprintf("Test %i for StateSinceHeight (delayed)", num));
                BOOST_CHECK_MESSAGE(checker_always[i].GetStateSinceHeightFor(tip) == 0, strprintf("Test %i for StateSinceHeight (always active)", num));
                BOOST_CHECK_MESSAGE(checker_never[i].GetStateSinceHeightFor(tip) == 0, strprintf("Test %i for StateSinceHeight (never active)", num));
            }
        }
        num++;
        return *this;
    }